

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Script::~Script(Script *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar2;
  pointer pVVar3;
  RuntimeID *pRVar4;
  _func_void__Op_any_ptr__Arg_ptr *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer puVar7;
  pointer p;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  Variant *s;
  pointer pVVar11;
  RuntimeID *pRVar12;
  CollectionPtr c;
  long local_40;
  undefined8 local_38;
  
  pVVar11 = (this->m_stack).
            super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->m_stack).
           super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar11 != pVVar3) {
    do {
      if (pVVar11->m_type == Collection) {
        Variant::GetCollection((Variant *)&local_40);
        p_Var10 = (_Rb_tree_node_base *)(local_40 + 8);
        for (p_Var9 = *(_Rb_tree_node_base **)(local_40 + 0x18); p_Var9 != p_Var10;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          Variant::SetNull((Variant *)&p_Var9[2]._M_parent);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
      }
      pVVar11 = pVVar11 + 1;
    } while (pVVar11 != pVVar3);
  }
  pRVar4 = (this->m_localFunctions).
           super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar12 = (this->m_localFunctions).
                 super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start; pRVar12 != pRVar4; pRVar12 = pRVar12 + 1
      ) {
    Runtime::UnregisterFunction
              ((this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,*pRVar12);
  }
  paVar2 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)(this->m_name)._M_dataplus._M_p != paVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
              (&this->m_name,paVar2->_M_allocated_capacity);
  }
  p_Var5 = (this->m_userContext)._M_manager;
  if (p_Var5 != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*p_Var5)(_Op_destroy,&this->m_userContext,(_Arg *)0x0);
    (this->m_userContext)._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  p_Var6 = (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  puVar7 = (this->m_localFunctions).
           super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    StaticArena<4096UL,_16UL>::deallocate
              ((this->m_localFunctions).
               super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>
               ._M_impl.super__Tp_alloc_type.m_arena,(char *)puVar7,
               (long)(this->m_localFunctions).
                     super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  p = (this->m_idIndexData).
      super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_start;
  if (p != (pointer)0x0) {
    StaticArena<4096UL,_16UL>::deallocate
              ((this->m_idIndexData).
               super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
               ._M_impl.super__Tp_alloc_type.m_arena,(char *)p,
               (long)(this->m_idIndexData).
                     super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)p);
  }
  puVar7 = (this->m_scopeStack).
           super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    StaticArena<4096UL,_16UL>::deallocate
              ((this->m_scopeStack).
               super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>
               ._M_impl.super__Tp_alloc_type.m_arena,(char *)puVar7,
               (long)(this->m_scopeStack).
                     super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::~vector
            (&this->m_stack);
  std::
  vector<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
  ::~vector(&this->m_execution);
  (this->m_staticArena).m_ptr = (char *)0x0;
  p_Var6 = (this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  p_Var6 = (this->super_enable_shared_from_this<Jinx::Impl::Script>)._M_weak_this.
           super___weak_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var6->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = p_Var6->_M_weak_count;
      p_Var6->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*p_Var6->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

inline_t Script::~Script()
	{
		// Clear potential circular references by explicitly destroying collection values
		for (auto & s : m_stack)
		{
			if (s.IsCollection())
			{
				auto c = s.GetCollection();
				for (auto & e : *c)
				{
					e.second.SetNull();
				}
			}
		}

		// Unregister local functions
		for (auto id : m_localFunctions)
			m_runtime->UnregisterFunction(id);
	}